

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

float duckdb::TryCastCInternal<signed_char,float,duckdb::TryCast>
                (duckdb_result *result,idx_t col,idx_t row)

{
  char cVar1;
  bool bVar2;
  float result_value;
  undefined2 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffca;
  undefined1 in_stack_ffffffffffffffcb;
  undefined4 in_stack_ffffffffffffffcc;
  undefined7 in_stack_ffffffffffffffd0;
  int8_t in_stack_ffffffffffffffd7;
  undefined4 local_24;
  undefined4 local_4;
  
  cVar1 = UnsafeFetch<signed_char>
                    ((duckdb_result *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                     CONCAT44(in_stack_ffffffffffffffcc,
                              CONCAT13(in_stack_ffffffffffffffcb,
                                       CONCAT12(in_stack_ffffffffffffffca,in_stack_ffffffffffffffc8)
                                      )),0x1946137);
  bVar2 = TryCast::Operation<signed_char,float>
                    (in_stack_ffffffffffffffd7,
                     (float *)CONCAT44(in_stack_ffffffffffffffcc,
                                       CONCAT13(cVar1,CONCAT12(in_stack_ffffffffffffffca,
                                                               in_stack_ffffffffffffffc8))),false);
  if (bVar2) {
    local_4 = local_24;
  }
  else {
    local_4 = FetchDefaultValue::Operation<float>();
  }
  return local_4;
}

Assistant:

RESULT_TYPE TryCastCInternal(duckdb_result *result, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!OP::template Operation<SOURCE_TYPE, RESULT_TYPE>(UnsafeFetch<SOURCE_TYPE>(result, col, row),
		                                                      result_value)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}